

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug-test.c++
# Opt level: O3

void __thiscall
kj::_::anon_unknown_0::MockExceptionCallback::onRecoverableException
          (MockExceptionCallback *this,Exception *exception)

{
  string *this_00;
  char *pcVar1;
  size_t sVar2;
  char *__s;
  char *ptrCopy;
  String what;
  StringPtr local_68;
  StringPtr local_58;
  undefined8 *local_48;
  char *local_40;
  undefined8 local_38;
  
  this_00 = &this->text;
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (this_00,"recoverable exception: ");
  kj::operator*(&local_58,exception);
  sVar2 = local_58.content.size_;
  pcVar1 = local_58.content.ptr;
  local_40 = "\nstack: ";
  local_38 = 9;
  __s = "";
  if (local_58.content.size_ != 0) {
    __s = local_58.content.ptr;
  }
  local_58.content.size_ = local_58.content.size_ + (local_58.content.size_ == 0);
  local_58.content.ptr = __s;
  StringPtr::find(&local_68,&local_58);
  if ((char)local_68.content.ptr == '\x01') {
    ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
              (this_00,(this->text)._M_string_length,0,__s,local_68.content.size_);
  }
  else {
    ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (this_00,__s);
  }
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (this_00,'\n');
  flush(this);
  if (pcVar1 != (char *)0x0) {
    (**(code **)*local_48)(local_48,pcVar1,1,sVar2,sVar2,0);
  }
  return;
}

Assistant:

void onRecoverableException(Exception&& exception) override {
    text += "recoverable exception: ";
    auto what = str(exception);
    // Discard the stack trace.
    KJ_IF_SOME(end, what.find("\nstack: ")) {
      text.append(what.cStr(), what.cStr()+end);
    } else {
      text += what.cStr();
    }